

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O3

void __thiscall
benchmark::State::State(State *this,size_t max_iters,bool has_x,int x,bool has_y,int y,int thread_i)

{
  ostream *in_RAX;
  CheckHandler local_18;
  
  this->started_ = false;
  this->total_iterations_ = 0;
  this->has_range_x_ = has_x;
  this->range_x_ = x;
  this->has_range_y_ = has_y;
  this->range_y_ = y;
  this->bytes_processed_ = 0;
  this->items_processed_ = 0;
  this->thread_index = thread_i;
  this->max_iterations = max_iters;
  if (max_iters == 0) {
    local_18.log_ = in_RAX;
    internal::CheckHandler::CheckHandler
              (&local_18,"max_iterations != 0",
               "/workspace/llm4binary/github/license_all_cmakelists_25/reBass[P]libbeatnik/external/reLib/tests/external/benchmark/src/benchmark.cc"
               ,"State",0x2eb);
  }
  else {
    local_18.log_ = internal::GetNullLogInstance();
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (local_18.log_,"At least one iteration must be run",0x22);
  if (max_iters != 0) {
    return;
  }
  internal::CheckHandler::~CheckHandler(&local_18);
}

Assistant:

State::State(size_t max_iters, bool has_x, int x, bool has_y, int y,
             int thread_i)
    : started_(false), total_iterations_(0),
      has_range_x_(has_x), range_x_(x),
      has_range_y_(has_y), range_y_(y),
      bytes_processed_(0), items_processed_(0),
      thread_index(thread_i),
      max_iterations(max_iters)
{
    CHECK(max_iterations != 0) << "At least one iteration must be run";
}